

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersectorKHybrid<8,_8,_16781328,_true,_embree::avx::VirtualCurveIntersectorK<8>,_true>::
     occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  size_t sVar1;
  long lVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  char cVar33;
  bool bVar34;
  int iVar35;
  AABBNodeMB4D *node1;
  uint uVar36;
  uint uVar37;
  undefined4 uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong extraout_RDX;
  size_t *psVar41;
  BVH *pBVar42;
  BVH *pBVar43;
  NodeRef root;
  undefined1 (*pauVar44) [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar45;
  float fVar59;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  float fVar57;
  float fVar58;
  float fVar60;
  float fVar61;
  float fVar62;
  undefined1 in_ZMM0 [64];
  float fVar63;
  float fVar64;
  float fVar74;
  float fVar76;
  float fVar77;
  float fVar78;
  undefined1 auVar65 [16];
  float fVar73;
  float fVar75;
  float fVar79;
  float fVar81;
  float fVar83;
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  float fVar80;
  float fVar82;
  float fVar84;
  undefined1 auVar69 [32];
  undefined1 auVar66 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [64];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [64];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  float fVar107;
  undefined1 auVar106 [32];
  undefined1 auVar108 [16];
  float in_register_0000131c;
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  float fVar115;
  undefined1 auVar114 [32];
  float fVar116;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar121;
  float fVar122;
  float fVar123;
  float in_register_0000135c;
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  float fVar129;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  vfloat4 a0;
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [32];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  undefined1 in_ZMM15 [64];
  vbool<8> terminated;
  TravRayK<8,_true> tray;
  Precalculations pre;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  undefined1 local_5d20 [20];
  uint uStack_5d0c;
  uint uStack_5d08;
  uint uStack_5d04;
  BVH *local_5cf0;
  RayK<8> *local_5ce8;
  undefined1 local_5ce0 [32];
  uint local_5cc0;
  undefined4 uStack_5cbc;
  float fStack_5cb8;
  float fStack_5cb4;
  float fStack_5cb0;
  float fStack_5cac;
  float fStack_5ca8;
  float fStack_5ca4;
  undefined8 local_5ca0;
  float fStack_5c98;
  float fStack_5c94;
  float fStack_5c90;
  float fStack_5c8c;
  float fStack_5c88;
  float fStack_5c84;
  undefined1 local_5c80 [32];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5c60;
  undefined1 local_5c00 [8];
  float fStack_5bf8;
  float fStack_5bf4;
  float fStack_5bf0;
  float fStack_5bec;
  float fStack_5be8;
  float fStack_5be4;
  undefined1 local_5be0 [8];
  float fStack_5bd8;
  float fStack_5bd4;
  float fStack_5bd0;
  float fStack_5bcc;
  float fStack_5bc8;
  float fStack_5bc4;
  undefined1 local_5bc0 [8];
  float fStack_5bb8;
  float fStack_5bb4;
  float fStack_5bb0;
  float fStack_5bac;
  float fStack_5ba8;
  float fStack_5ba4;
  undefined1 local_5ba0 [8];
  float fStack_5b98;
  float fStack_5b94;
  float fStack_5b90;
  float fStack_5b8c;
  float fStack_5b88;
  undefined1 local_5b80 [8];
  float fStack_5b78;
  float fStack_5b74;
  float fStack_5b70;
  float fStack_5b6c;
  float fStack_5b68;
  undefined1 local_5b60 [8];
  float fStack_5b58;
  float fStack_5b54;
  float fStack_5b50;
  float fStack_5b4c;
  float fStack_5b48;
  undefined1 local_5b40 [32];
  undefined1 local_5b20 [32];
  undefined1 local_5b00 [32];
  undefined1 local_5ae0 [32];
  undefined1 local_5ac0 [32];
  undefined1 local_5aa0 [32];
  undefined4 local_5a80 [16];
  float local_5a40;
  float fStack_5a3c;
  float fStack_5a38;
  float fStack_5a34;
  float fStack_5a30;
  float fStack_5a2c;
  float fStack_5a28;
  float fStack_5a24;
  float local_5a20;
  float fStack_5a1c;
  float fStack_5a18;
  float fStack_5a14;
  float fStack_5a10;
  float fStack_5a0c;
  float fStack_5a08;
  float fStack_5a04;
  float local_5a00;
  float fStack_59fc;
  float fStack_59f8;
  float fStack_59f4;
  float fStack_59f0;
  float fStack_59ec;
  float fStack_59e8;
  float fStack_59e4;
  float local_59e0;
  float fStack_59dc;
  float fStack_59d8;
  float fStack_59d4;
  float fStack_59d0;
  float fStack_59cc;
  float fStack_59c8;
  float fStack_59c4;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_59c0;
  undefined1 local_59a0 [16];
  undefined1 auStack_5990 [16];
  undefined1 auStack_5980 [368];
  undefined8 local_5810;
  size_t local_5808 [561];
  undefined4 local_4680;
  undefined4 uStack_467c;
  undefined4 uStack_4678;
  undefined4 uStack_4674;
  undefined4 uStack_4670;
  undefined4 uStack_466c;
  undefined4 uStack_4668;
  undefined4 uStack_4664;
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  
  local_5cf0 = (BVH *)This->ptr;
  sVar1 = (local_5cf0->root).ptr;
  if (sVar1 != 8) {
    auVar50 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar96 = vpcmpeqd_avx(auVar50,*(undefined1 (*) [16])(valid_i->field_0).field_1.vl);
    auVar50 = vpcmpeqd_avx(auVar50,*(undefined1 (*) [16])((long)&valid_i->field_0 + 0x10));
    auVar92 = *(undefined1 (*) [32])(ray + 0x100);
    auVar101 = vcmpps_avx(auVar92,ZEXT1632(ZEXT816(0) << 0x40),5);
    auVar67._16_16_ = auVar50;
    auVar67._0_16_ = auVar96;
    local_5aa0 = vandps_avx(auVar101,auVar67);
    uVar37 = vmovmskps_avx(local_5aa0);
    if (uVar37 != 0) {
      local_5ce8 = ray + 0x100;
      _local_5c00 = *(undefined1 (*) [32])(ray + 0x80);
      _local_5be0 = *(undefined1 (*) [32])(ray + 0xa0);
      _local_5bc0 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar109._0_4_ =
           local_5c00._0_4_ * local_5c00._0_4_ +
           local_5bc0._0_4_ * local_5bc0._0_4_ + local_5be0._0_4_ * local_5be0._0_4_;
      auVar109._4_4_ =
           local_5c00._4_4_ * local_5c00._4_4_ +
           local_5bc0._4_4_ * local_5bc0._4_4_ + local_5be0._4_4_ * local_5be0._4_4_;
      auVar109._8_4_ =
           local_5c00._8_4_ * local_5c00._8_4_ +
           local_5bc0._8_4_ * local_5bc0._8_4_ + local_5be0._8_4_ * local_5be0._8_4_;
      auVar109._12_4_ =
           local_5c00._12_4_ * local_5c00._12_4_ +
           local_5bc0._12_4_ * local_5bc0._12_4_ + local_5be0._12_4_ * local_5be0._12_4_;
      auVar109._16_4_ =
           local_5c00._16_4_ * local_5c00._16_4_ +
           local_5bc0._16_4_ * local_5bc0._16_4_ + local_5be0._16_4_ * local_5be0._16_4_;
      auVar109._20_4_ =
           local_5c00._20_4_ * local_5c00._20_4_ +
           local_5bc0._20_4_ * local_5bc0._20_4_ + local_5be0._20_4_ * local_5be0._20_4_;
      auVar109._24_4_ =
           local_5c00._24_4_ * local_5c00._24_4_ +
           local_5bc0._24_4_ * local_5bc0._24_4_ + local_5be0._24_4_ * local_5be0._24_4_;
      auVar109._28_4_ = in_register_0000135c + in_register_0000131c + in_register_0000135c;
      auVar101 = vrsqrtps_avx(auVar109);
      uVar39 = (ulong)(uVar37 & 0xff);
      fVar116 = auVar101._0_4_;
      fVar121 = auVar101._4_4_;
      fVar122 = auVar101._8_4_;
      fVar123 = auVar101._12_4_;
      fVar63 = auVar101._16_4_;
      fVar73 = auVar101._20_4_;
      fVar75 = auVar101._24_4_;
      local_59c0.v[0] = fVar116 * 1.5 + fVar116 * fVar116 * fVar116 * auVar109._0_4_ * -0.5;
      local_59c0.v[1] = fVar121 * 1.5 + fVar121 * fVar121 * fVar121 * auVar109._4_4_ * -0.5;
      local_59c0.v[2] = fVar122 * 1.5 + fVar122 * fVar122 * fVar122 * auVar109._8_4_ * -0.5;
      local_59c0.v[3] = fVar123 * 1.5 + fVar123 * fVar123 * fVar123 * auVar109._12_4_ * -0.5;
      local_59c0.v[4] = fVar63 * 1.5 + fVar63 * fVar63 * fVar63 * auVar109._16_4_ * -0.5;
      local_59c0.v[5] = fVar73 * 1.5 + fVar73 * fVar73 * fVar73 * auVar109._20_4_ * -0.5;
      local_59c0.v[6] = fVar75 * 1.5 + fVar75 * fVar75 * fVar75 * auVar109._24_4_ * -0.5;
      local_59c0.v[7] = auVar109._28_4_ + 1.5;
      auVar50._8_4_ = 0x80000000;
      auVar50._0_8_ = 0x8000000080000000;
      auVar50._12_4_ = 0x80000000;
      auVar96 = ZEXT816(0) << 0x20;
      pBVar42 = (BVH *)This;
      while (uVar39 != 0) {
        lVar2 = 0;
        if (uVar39 != 0) {
          for (; (uVar39 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
          }
        }
        auVar66 = vinsertps_avx(ZEXT416(*(uint *)(ray + lVar2 * 4 + 0x80)),
                                ZEXT416(*(uint *)(ray + lVar2 * 4 + 0xa0)),0x1c);
        auVar66 = vinsertps_avx(auVar66,ZEXT416(*(uint *)(ray + lVar2 * 4 + 0xc0)),0x28);
        fVar116 = *(float *)((long)&local_59c0 + lVar2 * 4);
        auVar140._0_4_ = auVar66._0_4_ * fVar116;
        auVar140._4_4_ = auVar66._4_4_ * fVar116;
        auVar140._8_4_ = auVar66._8_4_ * fVar116;
        auVar140._12_4_ = auVar66._12_4_ * fVar116;
        auVar146 = vshufpd_avx(auVar140,auVar140,1);
        auVar66 = vmovshdup_avx(auVar140);
        auVar142 = vunpckhps_avx(auVar140,auVar96);
        auVar145._8_8_ = 0;
        auVar145._0_8_ = (ulong)auVar66._0_4_ ^ 0x80000000;
        auVar143 = vshufps_avx(auVar142,auVar145,0x41);
        auVar142._0_8_ = auVar146._0_8_ ^ 0x8000000080000000;
        auVar142._8_8_ = auVar146._8_8_ ^ auVar50._8_8_;
        auVar142 = vinsertps_avx(auVar142,auVar140,0x2a);
        auVar66 = vdpps_avx(auVar143,auVar143,0x7f);
        auVar146 = vdpps_avx(auVar142,auVar142,0x7f);
        auVar66 = vcmpps_avx(auVar146,auVar66,1);
        auVar66 = vshufps_avx(auVar66,auVar66,0);
        auVar66 = vblendvps_avx(auVar142,auVar143,auVar66);
        auVar146 = vdpps_avx(auVar66,auVar66,0x7f);
        auVar142 = vrsqrtss_avx(auVar146,auVar146);
        fVar121 = auVar142._0_4_;
        auVar146 = ZEXT416((uint)(fVar121 * 1.5 - auVar146._0_4_ * 0.5 * fVar121 * fVar121 * fVar121
                                 ));
        auVar146 = vshufps_avx(auVar146,auVar146,0);
        auVar143._0_4_ = auVar66._0_4_ * auVar146._0_4_;
        auVar143._4_4_ = auVar66._4_4_ * auVar146._4_4_;
        auVar143._8_4_ = auVar66._8_4_ * auVar146._8_4_;
        auVar143._12_4_ = auVar66._12_4_ * auVar146._12_4_;
        auVar66 = vshufps_avx(auVar143,auVar143,0xc9);
        auVar146 = vshufps_avx(auVar140,auVar140,0xc9);
        auVar148._0_4_ = auVar146._0_4_ * auVar143._0_4_;
        auVar148._4_4_ = auVar146._4_4_ * auVar143._4_4_;
        auVar148._8_4_ = auVar146._8_4_ * auVar143._8_4_;
        auVar148._12_4_ = auVar146._12_4_ * auVar143._12_4_;
        auVar146._0_4_ = auVar140._0_4_ * auVar66._0_4_;
        auVar146._4_4_ = auVar140._4_4_ * auVar66._4_4_;
        auVar146._8_4_ = auVar140._8_4_ * auVar66._8_4_;
        auVar146._12_4_ = auVar140._12_4_ * auVar66._12_4_;
        auVar66 = vsubps_avx(auVar146,auVar148);
        auVar142 = vshufps_avx(auVar66,auVar66,0xc9);
        auVar66 = vdpps_avx(auVar142,auVar142,0x7f);
        uVar39 = uVar39 & uVar39 - 1;
        auVar146 = vrsqrtss_avx(auVar66,auVar66);
        fVar121 = auVar146._0_4_;
        auVar66 = ZEXT416((uint)(fVar121 * 1.5 - auVar66._0_4_ * 0.5 * fVar121 * fVar121 * fVar121))
        ;
        auVar66 = vshufps_avx(auVar66,auVar66,0);
        auVar147._0_4_ = auVar66._0_4_ * auVar142._0_4_;
        auVar147._4_4_ = auVar66._4_4_ * auVar142._4_4_;
        auVar147._8_4_ = auVar66._8_4_ * auVar142._8_4_;
        auVar147._12_4_ = auVar66._12_4_ * auVar142._12_4_;
        auVar66._0_4_ = fVar116 * auVar140._0_4_;
        auVar66._4_4_ = fVar116 * auVar140._4_4_;
        auVar66._8_4_ = fVar116 * auVar140._8_4_;
        auVar66._12_4_ = fVar116 * auVar140._12_4_;
        auVar142 = vunpcklps_avx(auVar143,auVar66);
        auVar66 = vunpckhps_avx(auVar143,auVar66);
        auVar143 = vunpcklps_avx(auVar147,auVar96);
        auVar146 = vunpckhps_avx(auVar147,auVar96);
        auVar146 = vunpcklps_avx(auVar66,auVar146);
        auVar140 = vunpcklps_avx(auVar142,auVar143);
        auVar66 = vunpckhps_avx(auVar142,auVar143);
        pBVar42 = (BVH *)(lVar2 * 0x30);
        *(undefined1 (*) [16])(local_59a0 + (long)pBVar42) = auVar140;
        *(undefined1 (*) [16])(auStack_5990 + (long)pBVar42) = auVar66;
        *(undefined1 (*) [16])(auStack_5980 + (long)pBVar42) = auVar146;
      }
      local_5c60._0_4_ = (undefined4)*(undefined8 *)ray;
      local_5c60._4_4_ = (undefined4)((ulong)*(undefined8 *)ray >> 0x20);
      local_5c60._8_4_ = (undefined4)*(undefined8 *)(ray + 8);
      local_5c60._12_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 8) >> 0x20);
      local_5c60._16_4_ = (undefined4)*(undefined8 *)(ray + 0x10);
      local_5c60._20_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x10) >> 0x20);
      local_5c60._24_4_ = (undefined4)*(undefined8 *)(ray + 0x18);
      local_5c60._28_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x18) >> 0x20);
      local_5c60._32_4_ = (undefined4)*(undefined8 *)(ray + 0x20);
      local_5c60._36_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x20) >> 0x20);
      local_5c60._40_4_ = (undefined4)*(undefined8 *)(ray + 0x28);
      local_5c60._44_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x28) >> 0x20);
      local_5c60._48_4_ = (undefined4)*(undefined8 *)(ray + 0x30);
      local_5c60._52_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x30) >> 0x20);
      local_5c60._56_4_ = (undefined4)*(undefined8 *)(ray + 0x38);
      local_5c60._60_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x38) >> 0x20);
      local_5c60._64_4_ = (undefined4)*(undefined8 *)(ray + 0x40);
      local_5c60._68_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x40) >> 0x20);
      local_5c60._72_4_ = (undefined4)*(undefined8 *)(ray + 0x48);
      local_5c60._76_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x48) >> 0x20);
      local_5c60._80_4_ = (undefined4)*(undefined8 *)(ray + 0x50);
      local_5c60._84_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x50) >> 0x20);
      local_5c60._88_4_ = (undefined4)*(undefined8 *)(ray + 0x58);
      local_5c60._92_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x58) >> 0x20);
      auVar126._8_4_ = 0x7fffffff;
      auVar126._0_8_ = 0x7fffffff7fffffff;
      auVar126._12_4_ = 0x7fffffff;
      auVar126._16_4_ = 0x7fffffff;
      auVar126._20_4_ = 0x7fffffff;
      auVar126._24_4_ = 0x7fffffff;
      auVar126._28_4_ = 0x7fffffff;
      auVar138._8_4_ = 0x219392ef;
      auVar138._0_8_ = 0x219392ef219392ef;
      auVar138._12_4_ = 0x219392ef;
      auVar138._16_4_ = 0x219392ef;
      auVar138._20_4_ = 0x219392ef;
      auVar138._24_4_ = 0x219392ef;
      auVar138._28_4_ = 0x219392ef;
      auVar141._8_4_ = 0x3f800000;
      auVar141._0_8_ = 0x3f8000003f800000;
      auVar141._12_4_ = 0x3f800000;
      auVar141._16_4_ = 0x3f800000;
      auVar141._20_4_ = 0x3f800000;
      auVar141._24_4_ = 0x3f800000;
      auVar141._28_4_ = 0x3f800000;
      auVar97 = vdivps_avx(auVar141,_local_5c00);
      auVar101 = vandps_avx(_local_5c00,auVar126);
      auVar67 = vcmpps_avx(auVar101,auVar138,1);
      auVar101 = vandps_avx(_local_5be0,auVar126);
      auVar109 = vcmpps_avx(auVar101,auVar138,1);
      auVar98 = vdivps_avx(auVar141,_local_5be0);
      auVar101 = vandps_avx(_local_5bc0,auVar126);
      auVar130._8_4_ = 0x5d5e0b6b;
      auVar130._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar130._12_4_ = 0x5d5e0b6b;
      auVar130._16_4_ = 0x5d5e0b6b;
      auVar130._20_4_ = 0x5d5e0b6b;
      auVar130._24_4_ = 0x5d5e0b6b;
      auVar130._28_4_ = 0x5d5e0b6b;
      _local_5ba0 = vblendvps_avx(auVar97,auVar130,auVar67);
      auVar101 = vcmpps_avx(auVar101,auVar138,1);
      auVar67 = vdivps_avx(auVar141,_local_5bc0);
      _local_5b80 = vblendvps_avx(auVar98,auVar130,auVar109);
      _local_5b60 = vblendvps_avx(auVar67,auVar130,auVar101);
      auVar101 = vcmpps_avx(_local_5ba0,ZEXT832(0) << 0x20,1);
      auVar97._8_4_ = 0x20;
      auVar97._0_8_ = 0x2000000020;
      auVar97._12_4_ = 0x20;
      auVar97._16_4_ = 0x20;
      auVar97._20_4_ = 0x20;
      auVar97._24_4_ = 0x20;
      auVar97._28_4_ = 0x20;
      local_5b40 = vandps_avx(auVar101,auVar97);
      auVar101 = vcmpps_avx(_local_5b80,ZEXT832(0) << 0x20,5);
      auVar98._8_4_ = 0x40;
      auVar98._0_8_ = 0x4000000040;
      auVar98._12_4_ = 0x40;
      auVar98._16_4_ = 0x40;
      auVar98._20_4_ = 0x40;
      auVar98._24_4_ = 0x40;
      auVar98._28_4_ = 0x40;
      auVar119._8_4_ = 0x60;
      auVar119._0_8_ = 0x6000000060;
      auVar119._12_4_ = 0x60;
      auVar119._16_4_ = 0x60;
      auVar119._20_4_ = 0x60;
      auVar119._24_4_ = 0x60;
      auVar119._28_4_ = 0x60;
      local_5b20 = vblendvps_avx(auVar119,auVar98,auVar101);
      auVar67 = ZEXT832(0) << 0x20;
      auVar101 = vcmpps_avx(_local_5b60,auVar67,5);
      auVar99._8_4_ = 0x80;
      auVar99._0_8_ = 0x8000000080;
      auVar99._12_4_ = 0x80;
      auVar99._16_4_ = 0x80;
      auVar99._20_4_ = 0x80;
      auVar99._24_4_ = 0x80;
      auVar99._28_4_ = 0x80;
      auVar110._8_4_ = 0xa0;
      auVar110._0_8_ = 0xa0000000a0;
      auVar110._12_4_ = 0xa0;
      auVar110._16_4_ = 0xa0;
      auVar110._20_4_ = 0xa0;
      auVar110._24_4_ = 0xa0;
      auVar110._28_4_ = 0xa0;
      local_5b00 = vblendvps_avx(auVar110,auVar99,auVar101);
      auVar101 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar67);
      auVar100._8_4_ = 0x7f800000;
      auVar100._0_8_ = 0x7f8000007f800000;
      auVar100._12_4_ = 0x7f800000;
      auVar100._16_4_ = 0x7f800000;
      auVar100._20_4_ = 0x7f800000;
      auVar100._24_4_ = 0x7f800000;
      auVar100._28_4_ = 0x7f800000;
      auVar93 = ZEXT3264(local_5aa0);
      local_5ae0 = vblendvps_avx(auVar100,auVar101,local_5aa0);
      auVar92 = vmaxps_avx(auVar92,auVar67);
      auVar101._8_4_ = 0xff800000;
      auVar101._0_8_ = 0xff800000ff800000;
      auVar101._12_4_ = 0xff800000;
      auVar101._16_4_ = 0xff800000;
      auVar101._20_4_ = 0xff800000;
      auVar101._24_4_ = 0xff800000;
      auVar101._28_4_ = 0xff800000;
      local_5ac0 = vblendvps_avx(auVar101,auVar92,local_5aa0);
      auVar92 = vcmpps_avx(local_5ac0,local_5ac0,0xf);
      local_5d20._4_4_ = local_5aa0._4_4_ ^ auVar92._4_4_;
      local_5d20._0_4_ = local_5aa0._0_4_ ^ auVar92._0_4_;
      local_5d20._8_4_ = local_5aa0._8_4_ ^ auVar92._8_4_;
      local_5d20._12_4_ = local_5aa0._12_4_ ^ auVar92._12_4_;
      local_5d20._16_4_ = local_5aa0._16_4_ ^ auVar92._16_4_;
      uStack_5d0c = local_5aa0._20_4_ ^ auVar92._20_4_;
      uStack_5d08 = local_5aa0._24_4_ ^ auVar92._24_4_;
      uStack_5d04 = local_5aa0._28_4_ ^ auVar92._28_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar37 = 7;
      }
      else {
        uVar37 = (uint)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                       RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
      }
      uVar39 = 0;
      psVar41 = local_5808 + 1;
      local_5810 = 0xfffffffffffffff8;
      pauVar44 = (undefined1 (*) [32])local_4640;
      local_4680 = 0x7f800000;
      uStack_467c = 0x7f800000;
      uStack_4678 = 0x7f800000;
      uStack_4674 = 0x7f800000;
      uStack_4670 = 0x7f800000;
      uStack_466c = 0x7f800000;
      uStack_4668 = 0x7f800000;
      uStack_4664 = 0x7f800000;
      local_5808[0] = sVar1;
      local_4660 = local_5ae0;
      local_5a80._32_8_ = mm_lookupmask_ps._16_8_;
      local_5a80._40_8_ = mm_lookupmask_ps._24_8_;
      local_5a80._48_8_ = mm_lookupmask_ps._16_8_;
      local_5a80._56_8_ = mm_lookupmask_ps._24_8_;
LAB_01035b9d:
      do {
        do {
          root.ptr = psVar41[-1];
          if (root.ptr == 0xfffffffffffffff8) goto LAB_01036562;
          psVar41 = psVar41 + -1;
          pauVar44 = pauVar44 + -1;
          auVar92 = *pauVar44;
          auVar72 = ZEXT3264(auVar92);
          auVar101 = vcmpps_avx(auVar92,local_5ac0,1);
        } while ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                      (auVar101 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar101 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    SUB321(auVar101 >> 0x7f,0) == '\0') &&
                   (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  SUB321(auVar101 >> 0xbf,0) == '\0') &&
                 (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 -1 < auVar101[0x1f]);
        uVar38 = vmovmskps_avx(auVar101);
        uVar39 = CONCAT44((int)(uVar39 >> 0x20),uVar38);
        local_5cc0 = POPCOUNT(uVar38);
        if (uVar37 < local_5cc0) {
LAB_01035bda:
          do {
            uVar40 = 0xffffffffffffffe0;
            if ((root.ptr & 8) != 0) {
              if ((BVH *)root.ptr == (BVH *)&DAT_fffffffffffffff8) goto LAB_01036562;
              auVar92 = vcmpps_avx(local_5ac0,auVar72._0_32_,6);
              if ((((((((auVar92 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar92 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar92 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar92 >> 0x7f,0) != '\0') ||
                    (auVar92 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar92 >> 0xbf,0) != '\0') ||
                  (auVar92 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar92[0x1f] < '\0') {
                local_5cc0 = local_5d20._0_4_;
                uStack_5cbc = local_5d20._4_4_;
                fStack_5cb8 = local_5d20._8_4_;
                fStack_5cb4 = local_5d20._12_4_;
                fStack_5cb0 = local_5d20._16_4_;
                fStack_5cac = local_5d20._20_4_;
                fStack_5ca8 = local_5d20._24_4_;
                fStack_5ca4 = local_5d20._28_4_;
                local_5a80[0] = local_5a80[8];
                local_5a80[1] = local_5a80[9];
                local_5a80[2] = local_5a80[10];
                local_5a80[3] = local_5a80[0xb];
                local_5a80[4] = local_5a80[0xc];
                local_5a80[5] = local_5a80[0xd];
                local_5a80[6] = local_5a80[0xe];
                local_5a80[7] = local_5a80[0xf];
                auVar50 = vpcmpeqd_avx(auVar93._0_16_,auVar93._0_16_);
                auVar93 = ZEXT1664(auVar50);
                auVar96 = vpcmpgtd_avx(stack0xffffffffffffa2f0,auVar50);
                auVar50 = vpcmpgtd_avx(local_5d20._0_16_,auVar50);
                auVar56._16_16_ = auVar96;
                auVar56._0_16_ = auVar50;
                uVar38 = vmovmskps_avx(auVar56);
                local_5ca0 = (undefined8 *)
                             ((long)This->leafIntersector +
                             (ulong)*(byte *)(root.ptr & 0xfffffffffffffff0) * 0x40 + 0x28);
                uVar40 = CONCAT44((int)((ulong)pBVar42 >> 0x20),uVar38);
                while (auVar50 = auVar93._0_16_, uVar40 != 0) {
                  lVar2 = 0;
                  if (uVar40 != 0) {
                    for (; (uVar40 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
                    }
                  }
                  local_5ce0._0_8_ = uVar40 & uVar40 - 1;
                  local_5c80._0_8_ = lVar2;
                  auVar93 = ZEXT1664(auVar50);
                  in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
                  cVar33 = (*(code *)*local_5ca0)
                                     (&local_59c0,ray,lVar2,context,
                                      (byte *)(root.ptr & 0xfffffffffffffff0));
                  uVar39 = extraout_RDX;
                  uVar40 = local_5ce0._0_8_;
                  if (cVar33 != '\0') {
                    local_5a80[local_5c80._0_8_] = 0xffffffff;
                  }
                }
                auVar23._4_4_ = uStack_5cbc;
                auVar23._0_4_ = local_5cc0;
                auVar23._8_4_ = fStack_5cb8;
                auVar23._12_4_ = fStack_5cb4;
                auVar23._16_4_ = fStack_5cb0;
                auVar23._20_4_ = fStack_5cac;
                auVar23._24_4_ = fStack_5ca8;
                auVar23._28_4_ = fStack_5ca4;
                auVar28._8_4_ = local_5a80[2];
                auVar28._12_4_ = local_5a80[3];
                auVar28._0_4_ = local_5a80[0];
                auVar28._4_4_ = local_5a80[1];
                auVar28._16_4_ = local_5a80[4];
                auVar28._20_4_ = local_5a80[5];
                auVar28._24_4_ = local_5a80[6];
                auVar28._28_4_ = local_5a80[7];
                _local_5d20 = vorps_avx(auVar23,auVar28);
                auVar50 = vpcmpeqd_avx(auVar50,auVar50);
                auVar96 = vpcmpgtd_avx(local_5d20._16_16_,auVar50);
                auVar50 = vpcmpgtd_avx(local_5d20._0_16_,auVar50);
                auVar50 = vpor_avx(auVar50,auVar96);
                if ((((auVar50 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar50 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar50 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < auVar50[0xf]) goto LAB_01036562;
                auVar91._8_4_ = 0xff800000;
                auVar91._0_8_ = 0xff800000ff800000;
                auVar91._12_4_ = 0xff800000;
                auVar91._16_4_ = 0xff800000;
                auVar91._20_4_ = 0xff800000;
                auVar91._24_4_ = 0xff800000;
                auVar91._28_4_ = 0xff800000;
                auVar93 = ZEXT3264(auVar91);
                local_5ac0 = vblendvps_avx(local_5ac0,auVar91,_local_5d20);
                pBVar42 = (BVH *)0x0;
              }
              goto LAB_01035b9d;
            }
            uVar39 = root.ptr & 0xfffffffffffffff0;
            uVar36 = (uint)root.ptr & 7;
            local_5c80 = vcmpps_avx(local_5ac0,auVar72._0_32_,6);
            auVar68._8_4_ = 0x7f800000;
            auVar68._0_8_ = 0x7f8000007f800000;
            auVar68._12_4_ = 0x7f800000;
            auVar68._16_4_ = 0x7f800000;
            auVar68._20_4_ = 0x7f800000;
            auVar68._24_4_ = 0x7f800000;
            auVar68._28_4_ = 0x7f800000;
            root.ptr = (size_t)(BVH *)0x8;
            for (; (auVar92 = auVar68, auVar72 = ZEXT3264(auVar92), pBVar43 = pBVar42, uVar40 != 0
                   && (pBVar43 = *(BVH **)(uVar39 + 0x40 + uVar40 * 2), pBVar43 != (BVH *)0x8));
                uVar40 = uVar40 + 4) {
              if ((uVar36 == 6) || (uVar36 == 1)) {
                fVar116 = *(float *)(uVar39 + 0x120 + uVar40);
                fVar121 = *(float *)(uVar39 + 0x60 + uVar40);
                auVar101 = *(undefined1 (*) [32])(ray + 0xe0);
                fVar63 = auVar101._0_4_;
                fVar73 = auVar101._4_4_;
                fVar75 = auVar101._8_4_;
                fVar77 = auVar101._12_4_;
                fVar79 = auVar101._16_4_;
                fVar81 = auVar101._20_4_;
                fVar83 = auVar101._24_4_;
                fVar122 = *(float *)(uVar39 + 0x160 + uVar40);
                auVar51._0_4_ = fVar63 * fVar116 + fVar121;
                auVar51._4_4_ = fVar73 * fVar116 + fVar121;
                auVar51._8_4_ = fVar75 * fVar116 + fVar121;
                auVar51._12_4_ = fVar77 * fVar116 + fVar121;
                auVar51._16_4_ = fVar79 * fVar116 + fVar121;
                auVar51._20_4_ = fVar81 * fVar116 + fVar121;
                auVar51._24_4_ = fVar83 * fVar116 + fVar121;
                auVar51._28_4_ = fVar116 + fVar121;
                fVar116 = *(float *)(uVar39 + 0xa0 + uVar40);
                fVar121 = *(float *)(uVar39 + 0x1a0 + uVar40);
                fVar123 = *(float *)(uVar39 + 0xe0 + uVar40);
                auVar89._0_4_ = fVar63 * fVar122 + fVar116;
                auVar89._4_4_ = fVar73 * fVar122 + fVar116;
                auVar89._8_4_ = fVar75 * fVar122 + fVar116;
                auVar89._12_4_ = fVar77 * fVar122 + fVar116;
                auVar89._16_4_ = fVar79 * fVar122 + fVar116;
                auVar89._20_4_ = fVar81 * fVar122 + fVar116;
                auVar89._24_4_ = fVar83 * fVar122 + fVar116;
                auVar89._28_4_ = fVar122 + fVar116;
                fVar116 = *(float *)(uVar39 + 0x140 + uVar40);
                auVar102._0_4_ = fVar63 * fVar121 + fVar123;
                auVar102._4_4_ = fVar73 * fVar121 + fVar123;
                auVar102._8_4_ = fVar75 * fVar121 + fVar123;
                auVar102._12_4_ = fVar77 * fVar121 + fVar123;
                auVar102._16_4_ = fVar79 * fVar121 + fVar123;
                auVar102._20_4_ = fVar81 * fVar121 + fVar123;
                auVar102._24_4_ = fVar83 * fVar121 + fVar123;
                auVar102._28_4_ = fVar122 + fVar123;
                fVar121 = *(float *)(uVar39 + 0x80 + uVar40);
                fVar122 = *(float *)(uVar39 + 0x180 + uVar40);
                fVar123 = *(float *)(uVar39 + 0xc0 + uVar40);
                auVar111._0_4_ = fVar63 * fVar116 + fVar121;
                auVar111._4_4_ = fVar73 * fVar116 + fVar121;
                auVar111._8_4_ = fVar75 * fVar116 + fVar121;
                auVar111._12_4_ = fVar77 * fVar116 + fVar121;
                auVar111._16_4_ = fVar79 * fVar116 + fVar121;
                auVar111._20_4_ = fVar81 * fVar116 + fVar121;
                auVar111._24_4_ = fVar83 * fVar116 + fVar121;
                auVar111._28_4_ = fVar116 + fVar121;
                fVar116 = *(float *)(uVar39 + 0x1c0 + uVar40);
                auVar120._0_4_ = fVar63 * fVar122 + fVar123;
                auVar120._4_4_ = fVar73 * fVar122 + fVar123;
                auVar120._8_4_ = fVar75 * fVar122 + fVar123;
                auVar120._12_4_ = fVar77 * fVar122 + fVar123;
                auVar120._16_4_ = fVar79 * fVar122 + fVar123;
                auVar120._20_4_ = fVar81 * fVar122 + fVar123;
                auVar120._24_4_ = fVar83 * fVar122 + fVar123;
                auVar120._28_4_ = fVar121 + fVar123;
                fVar121 = *(float *)(uVar39 + 0x100 + uVar40);
                auVar127._0_4_ = fVar63 * fVar116 + fVar121;
                auVar127._4_4_ = fVar73 * fVar116 + fVar121;
                auVar127._8_4_ = fVar75 * fVar116 + fVar121;
                auVar127._12_4_ = fVar77 * fVar116 + fVar121;
                auVar127._16_4_ = fVar79 * fVar116 + fVar121;
                auVar127._20_4_ = fVar81 * fVar116 + fVar121;
                auVar127._24_4_ = fVar83 * fVar116 + fVar121;
                auVar127._28_4_ = fVar116 + fVar121;
                auVar25._4_4_ = local_5c60._4_4_;
                auVar25._0_4_ = local_5c60._0_4_;
                auVar25._8_4_ = local_5c60._8_4_;
                auVar25._12_4_ = local_5c60._12_4_;
                auVar25._16_4_ = local_5c60._16_4_;
                auVar25._20_4_ = local_5c60._20_4_;
                auVar25._24_4_ = local_5c60._24_4_;
                auVar25._28_4_ = local_5c60._28_4_;
                auVar26._4_4_ = local_5c60._36_4_;
                auVar26._0_4_ = local_5c60._32_4_;
                auVar26._8_4_ = local_5c60._40_4_;
                auVar26._12_4_ = local_5c60._44_4_;
                auVar26._16_4_ = local_5c60._48_4_;
                auVar26._20_4_ = local_5c60._52_4_;
                auVar26._24_4_ = local_5c60._56_4_;
                auVar26._28_4_ = local_5c60._60_4_;
                auVar27._4_4_ = local_5c60._68_4_;
                auVar27._0_4_ = local_5c60._64_4_;
                auVar27._8_4_ = local_5c60._72_4_;
                auVar27._12_4_ = local_5c60._76_4_;
                auVar27._16_4_ = local_5c60._80_4_;
                auVar27._20_4_ = local_5c60._84_4_;
                auVar27._24_4_ = local_5c60._88_4_;
                auVar27._28_4_ = local_5c60._92_4_;
                auVar67 = vsubps_avx(auVar51,auVar25);
                auVar46._0_4_ = (float)local_5ba0._0_4_ * auVar67._0_4_;
                auVar46._4_4_ = (float)local_5ba0._4_4_ * auVar67._4_4_;
                auVar46._8_4_ = fStack_5b98 * auVar67._8_4_;
                auVar46._12_4_ = fStack_5b94 * auVar67._12_4_;
                auVar3._16_4_ = fStack_5b90 * auVar67._16_4_;
                auVar3._0_16_ = auVar46;
                auVar3._20_4_ = fStack_5b8c * auVar67._20_4_;
                auVar3._24_4_ = fStack_5b88 * auVar67._24_4_;
                auVar3._28_4_ = auVar67._28_4_;
                auVar67 = vsubps_avx(auVar89,auVar26);
                auVar85._0_4_ = (float)local_5b80._0_4_ * auVar67._0_4_;
                auVar85._4_4_ = (float)local_5b80._4_4_ * auVar67._4_4_;
                auVar85._8_4_ = fStack_5b78 * auVar67._8_4_;
                auVar85._12_4_ = fStack_5b74 * auVar67._12_4_;
                auVar4._16_4_ = fStack_5b70 * auVar67._16_4_;
                auVar4._0_16_ = auVar85;
                auVar4._20_4_ = fStack_5b6c * auVar67._20_4_;
                auVar4._24_4_ = fStack_5b68 * auVar67._24_4_;
                auVar4._28_4_ = auVar67._28_4_;
                auVar67 = vsubps_avx(auVar102,auVar27);
                auVar94._0_4_ = (float)local_5b60._0_4_ * auVar67._0_4_;
                auVar94._4_4_ = (float)local_5b60._4_4_ * auVar67._4_4_;
                auVar94._8_4_ = fStack_5b58 * auVar67._8_4_;
                auVar94._12_4_ = fStack_5b54 * auVar67._12_4_;
                auVar5._16_4_ = fStack_5b50 * auVar67._16_4_;
                auVar5._0_16_ = auVar94;
                auVar5._20_4_ = fStack_5b4c * auVar67._20_4_;
                auVar5._24_4_ = fStack_5b48 * auVar67._24_4_;
                auVar5._28_4_ = auVar67._28_4_;
                auVar67 = vsubps_avx(auVar111,auVar25);
                auVar108._0_4_ = (float)local_5ba0._0_4_ * auVar67._0_4_;
                auVar108._4_4_ = (float)local_5ba0._4_4_ * auVar67._4_4_;
                auVar108._8_4_ = fStack_5b98 * auVar67._8_4_;
                auVar108._12_4_ = fStack_5b94 * auVar67._12_4_;
                auVar6._16_4_ = fStack_5b90 * auVar67._16_4_;
                auVar6._0_16_ = auVar108;
                auVar6._20_4_ = fStack_5b8c * auVar67._20_4_;
                auVar6._24_4_ = fStack_5b88 * auVar67._24_4_;
                auVar6._28_4_ = auVar67._28_4_;
                auVar67 = vsubps_avx(auVar120,auVar26);
                auVar117._0_4_ = (float)local_5b80._0_4_ * auVar67._0_4_;
                auVar117._4_4_ = (float)local_5b80._4_4_ * auVar67._4_4_;
                auVar117._8_4_ = fStack_5b78 * auVar67._8_4_;
                auVar117._12_4_ = fStack_5b74 * auVar67._12_4_;
                auVar7._16_4_ = fStack_5b70 * auVar67._16_4_;
                auVar7._0_16_ = auVar117;
                auVar7._20_4_ = fStack_5b6c * auVar67._20_4_;
                auVar7._24_4_ = fStack_5b68 * auVar67._24_4_;
                auVar7._28_4_ = auVar67._28_4_;
                auVar67 = vsubps_avx(auVar127,auVar27);
                auVar124._0_4_ = (float)local_5b60._0_4_ * auVar67._0_4_;
                auVar124._4_4_ = (float)local_5b60._4_4_ * auVar67._4_4_;
                auVar124._8_4_ = fStack_5b58 * auVar67._8_4_;
                auVar124._12_4_ = fStack_5b54 * auVar67._12_4_;
                auVar8._16_4_ = fStack_5b50 * auVar67._16_4_;
                auVar8._0_16_ = auVar124;
                auVar8._20_4_ = fStack_5b4c * auVar67._20_4_;
                auVar8._24_4_ = fStack_5b48 * auVar67._24_4_;
                auVar8._28_4_ = auVar67._28_4_;
                auVar50 = vpminsd_avx(auVar3._16_16_,auVar6._16_16_);
                auVar96 = vpminsd_avx(auVar46,auVar108);
                auVar66 = vpminsd_avx(auVar4._16_16_,auVar7._16_16_);
                auVar50 = vpmaxsd_avx(auVar50,auVar66);
                auVar66 = vpminsd_avx(auVar85,auVar117);
                auVar96 = vpmaxsd_avx(auVar96,auVar66);
                auVar66 = vpminsd_avx(auVar94,auVar124);
                auVar96 = vpmaxsd_avx(auVar96,auVar66);
                auVar66 = vpminsd_avx(auVar5._16_16_,auVar8._16_16_);
                in_ZMM15 = ZEXT1664(auVar66);
                auVar50 = vpmaxsd_avx(auVar50,auVar66);
                auVar66 = vpmaxsd_avx(auVar3._16_16_,auVar6._16_16_);
                auVar146 = vpmaxsd_avx(auVar46,auVar108);
                auVar142 = vpmaxsd_avx(auVar4._16_16_,auVar7._16_16_);
                auVar142 = vpminsd_avx(auVar66,auVar142);
                auVar66 = vpmaxsd_avx(auVar85,auVar117);
                auVar146 = vpminsd_avx(auVar146,auVar66);
                auVar66 = vpmaxsd_avx(auVar94,auVar124);
                auVar66 = vpminsd_avx(auVar146,auVar66);
                auVar86._0_4_ = auVar96._0_4_ * 0.99999964;
                auVar86._4_4_ = auVar96._4_4_ * 0.99999964;
                auVar86._8_4_ = auVar96._8_4_ * 0.99999964;
                auVar86._12_4_ = auVar96._12_4_ * 0.99999964;
                auVar9._16_4_ = auVar50._0_4_ * 0.99999964;
                auVar9._0_16_ = auVar86;
                auVar9._20_4_ = auVar50._4_4_ * 0.99999964;
                auVar9._24_4_ = auVar50._8_4_ * 0.99999964;
                auVar9._28_4_ = 0x3f7ffffa;
                auVar93 = ZEXT3264(auVar9);
                auVar50 = vpmaxsd_avx(auVar5._16_16_,auVar8._16_16_);
                auVar50 = vpminsd_avx(auVar142,auVar50);
                auVar47._0_4_ = auVar66._0_4_ * 1.0000004;
                auVar47._4_4_ = auVar66._4_4_ * 1.0000004;
                auVar47._8_4_ = auVar66._8_4_ * 1.0000004;
                auVar47._12_4_ = auVar66._12_4_ * 1.0000004;
                auVar10._16_4_ = auVar50._0_4_ * 1.0000004;
                auVar10._0_16_ = auVar47;
                auVar10._20_4_ = auVar50._4_4_ * 1.0000004;
                auVar10._24_4_ = auVar50._8_4_ * 1.0000004;
                auVar10._28_4_ = auVar50._12_4_;
                auVar50 = vpmaxsd_avx(auVar86,local_5ae0._0_16_);
                auVar96 = vpmaxsd_avx(auVar9._16_16_,local_5ae0._16_16_);
                auVar66 = vpminsd_avx(auVar47,local_5ac0._0_16_);
                auVar146 = vpminsd_avx(auVar10._16_16_,local_5ac0._16_16_);
                auVar103._16_16_ = auVar96;
                auVar103._0_16_ = auVar50;
                auVar52._16_16_ = auVar146;
                auVar52._0_16_ = auVar66;
                auVar67 = vcmpps_avx(auVar103,auVar52,2);
                if (uVar36 == 6) {
                  uVar38 = *(undefined4 *)(uVar39 + 0x1e0 + uVar40);
                  auVar104._4_4_ = uVar38;
                  auVar104._0_4_ = uVar38;
                  auVar104._8_4_ = uVar38;
                  auVar104._12_4_ = uVar38;
                  auVar104._16_4_ = uVar38;
                  auVar104._20_4_ = uVar38;
                  auVar104._24_4_ = uVar38;
                  auVar104._28_4_ = uVar38;
                  auVar109 = vcmpps_avx(auVar104,auVar101,2);
                  uVar38 = *(undefined4 *)(uVar39 + 0x200 + uVar40);
                  auVar112._4_4_ = uVar38;
                  auVar112._0_4_ = uVar38;
                  auVar112._8_4_ = uVar38;
                  auVar112._12_4_ = uVar38;
                  auVar112._16_4_ = uVar38;
                  auVar112._20_4_ = uVar38;
                  auVar112._24_4_ = uVar38;
                  auVar112._28_4_ = uVar38;
                  auVar101 = vcmpps_avx(auVar101,auVar112,1);
                  auVar101 = vandps_avx(auVar109,auVar101);
                  auVar67 = vandps_avx(auVar101,auVar67);
                }
              }
              else {
                fVar116 = *(float *)(uVar39 + 0xc0 + uVar40);
                fVar121 = *(float *)(uVar39 + 0xe0 + uVar40);
                fVar122 = *(float *)(uVar39 + 0x100 + uVar40);
                fVar123 = *(float *)(uVar39 + 0x120 + uVar40);
                fVar63 = *(float *)(uVar39 + 0x140 + uVar40);
                fStack_5a04 = *(float *)(uVar39 + 0x1e0 + uVar40);
                fStack_59e4 = *(float *)(uVar39 + 0x200 + uVar40);
                fVar73 = *(float *)(uVar39 + 0x220 + uVar40);
                fVar75 = *(float *)(uVar39 + 0x240 + uVar40);
                fVar77 = *(float *)(uVar39 + 0x260 + uVar40);
                fVar79 = *(float *)(uVar39 + 0x280 + uVar40);
                auVar101 = *(undefined1 (*) [32])(ray + 0xe0);
                auVar105._8_4_ = 0x3f800000;
                auVar105._0_8_ = 0x3f8000003f800000;
                auVar105._12_4_ = 0x3f800000;
                auVar105._16_4_ = 0x3f800000;
                auVar105._20_4_ = 0x3f800000;
                auVar105._24_4_ = 0x3f800000;
                auVar105._28_4_ = 0x3f800000;
                auVar67 = vsubps_avx(auVar105,auVar101);
                fVar149 = auVar101._0_4_;
                fVar150 = auVar101._4_4_;
                fVar81 = auVar101._8_4_;
                fVar83 = auVar101._12_4_;
                fVar151 = auVar101._16_4_;
                fVar152 = auVar101._20_4_;
                fVar153 = auVar101._24_4_;
                fVar154 = auVar67._0_4_;
                fVar156 = fVar154 * 0.0;
                fVar155 = auVar67._4_4_;
                fVar157 = fVar155 * 0.0;
                fStack_5cb8 = auVar67._8_4_;
                fStack_5c98 = fStack_5cb8 * 0.0;
                fStack_5cb4 = auVar67._12_4_;
                fStack_5c94 = fStack_5cb4 * 0.0;
                fStack_5cb0 = auVar67._16_4_;
                fStack_5c90 = fStack_5cb0 * 0.0;
                fStack_5cac = auVar67._20_4_;
                fStack_5c8c = fStack_5cac * 0.0;
                fStack_5ca8 = auVar67._24_4_;
                fStack_5c88 = fStack_5ca8 * 0.0;
                local_5a20 = fVar156 + fVar149 * fStack_5a04;
                fStack_5a1c = fVar157 + fVar150 * fStack_5a04;
                fStack_5a18 = fStack_5c98 + fVar81 * fStack_5a04;
                fStack_5a14 = fStack_5c94 + fVar83 * fStack_5a04;
                fStack_5a10 = fStack_5c90 + fVar151 * fStack_5a04;
                fStack_5a0c = fStack_5c8c + fVar152 * fStack_5a04;
                fStack_5a08 = fStack_5c88 + fVar153 * fStack_5a04;
                fStack_5c84 = in_ZMM15._28_4_;
                fStack_5a04 = fStack_5c84 + fStack_5a04;
                local_59e0 = fVar156 + fVar149 * fStack_59e4;
                fStack_59dc = fVar157 + fVar150 * fStack_59e4;
                fStack_59d8 = fStack_5c98 + fVar81 * fStack_59e4;
                fStack_59d4 = fStack_5c94 + fVar83 * fStack_59e4;
                fStack_59d0 = fStack_5c90 + fVar151 * fStack_59e4;
                fStack_59cc = fStack_5c8c + fVar152 * fStack_59e4;
                fStack_59c8 = fStack_5c88 + fVar153 * fStack_59e4;
                fStack_59c4 = fStack_5c84 + fStack_59e4;
                fStack_5c98 = fStack_5c98 + fVar81 * fVar73;
                fStack_5c94 = fStack_5c94 + fVar83 * fVar73;
                fStack_5c90 = fStack_5c90 + fVar151 * fVar73;
                fStack_5c8c = fStack_5c8c + fVar152 * fVar73;
                fStack_5c88 = fStack_5c88 + fVar153 * fVar73;
                fStack_5c84 = fStack_5c84 + fVar73;
                local_5a40 = fVar154 + fVar149 * fVar75;
                fStack_5a3c = fVar155 + fVar150 * fVar75;
                fStack_5a38 = fStack_5cb8 + fVar81 * fVar75;
                fStack_5a34 = fStack_5cb4 + fVar83 * fVar75;
                fStack_5a30 = fStack_5cb0 + fVar151 * fVar75;
                fStack_5a2c = fStack_5cac + fVar152 * fVar75;
                fStack_5a28 = fStack_5ca8 + fVar153 * fVar75;
                fVar45 = auVar67._28_4_;
                fStack_5a24 = fVar45 + fStack_5c84;
                local_5a00 = fVar154 + fVar149 * fVar77;
                fStack_59fc = fVar155 + fVar150 * fVar77;
                fStack_59f8 = fStack_5cb8 + fVar81 * fVar77;
                fStack_59f4 = fStack_5cb4 + fVar83 * fVar77;
                fStack_59f0 = fStack_5cb0 + fVar151 * fVar77;
                fStack_59ec = fStack_5cac + fVar152 * fVar77;
                fStack_59e8 = fStack_5ca8 + fVar153 * fVar77;
                fStack_59e4 = fVar45 + fStack_59e4;
                fStack_5cb8 = fStack_5cb8 + fVar81 * fVar79;
                fStack_5cb4 = fStack_5cb4 + fVar83 * fVar79;
                fStack_5cb0 = fStack_5cb0 + fVar151 * fVar79;
                fStack_5cac = fStack_5cac + fVar152 * fVar79;
                fStack_5ca8 = fStack_5ca8 + fVar153 * fVar79;
                fStack_5ca4 = fVar45 + fVar73;
                fVar77 = *(float *)(uVar39 + 0x160 + uVar40);
                in_ZMM15 = ZEXT3264(CONCAT428(fVar77,CONCAT424(fVar77,CONCAT420(fVar77,CONCAT416(
                                                  fVar77,CONCAT412(fVar77,CONCAT48(fVar77,CONCAT44(
                                                  fVar77,fVar77))))))));
                fVar81 = *(float *)(uVar39 + 0x60 + uVar40);
                fVar83 = *(float *)(uVar39 + 0x80 + uVar40);
                auVar113._0_4_ =
                     fVar81 * (float)local_5c00._0_4_ +
                     fVar116 * (float)local_5be0._0_4_ + fVar123 * (float)local_5bc0._0_4_;
                auVar113._4_4_ =
                     fVar81 * (float)local_5c00._4_4_ +
                     fVar116 * (float)local_5be0._4_4_ + fVar123 * (float)local_5bc0._4_4_;
                auVar113._8_4_ =
                     fVar81 * fStack_5bf8 + fVar116 * fStack_5bd8 + fVar123 * fStack_5bb8;
                auVar113._12_4_ =
                     fVar81 * fStack_5bf4 + fVar116 * fStack_5bd4 + fVar123 * fStack_5bb4;
                auVar113._16_4_ =
                     fVar81 * fStack_5bf0 + fVar116 * fStack_5bd0 + fVar123 * fStack_5bb0;
                auVar113._20_4_ =
                     fVar81 * fStack_5bec + fVar116 * fStack_5bcc + fVar123 * fStack_5bac;
                auVar113._24_4_ =
                     fVar81 * fStack_5be8 + fVar116 * fStack_5bc8 + fVar123 * fStack_5ba8;
                auVar113._28_4_ = fVar45 + auVar101._28_4_ + fVar73;
                fVar151 = *(float *)(uVar39 + 0xa0 + uVar40);
                auVar90._0_4_ =
                     fVar83 * (float)local_5c00._0_4_ +
                     fVar121 * (float)local_5be0._0_4_ + fVar63 * (float)local_5bc0._0_4_;
                auVar90._4_4_ =
                     fVar83 * (float)local_5c00._4_4_ +
                     fVar121 * (float)local_5be0._4_4_ + fVar63 * (float)local_5bc0._4_4_;
                auVar90._8_4_ = fVar83 * fStack_5bf8 + fVar121 * fStack_5bd8 + fVar63 * fStack_5bb8;
                auVar90._12_4_ = fVar83 * fStack_5bf4 + fVar121 * fStack_5bd4 + fVar63 * fStack_5bb4
                ;
                auVar90._16_4_ = fVar83 * fStack_5bf0 + fVar121 * fStack_5bd0 + fVar63 * fStack_5bb0
                ;
                auVar90._20_4_ = fVar83 * fStack_5bec + fVar121 * fStack_5bcc + fVar63 * fStack_5bac
                ;
                auVar90._24_4_ = fVar83 * fStack_5be8 + fVar121 * fStack_5bc8 + fVar63 * fStack_5ba8
                ;
                auVar90._28_4_ = fVar75 + auVar101._28_4_ + fVar79;
                auVar53._0_4_ =
                     fVar151 * (float)local_5c00._0_4_ +
                     fVar122 * (float)local_5be0._0_4_ + fVar77 * (float)local_5bc0._0_4_;
                auVar53._4_4_ =
                     fVar151 * (float)local_5c00._4_4_ +
                     fVar122 * (float)local_5be0._4_4_ + fVar77 * (float)local_5bc0._4_4_;
                auVar53._8_4_ = fVar151 * fStack_5bf8 + fVar122 * fStack_5bd8 + fVar77 * fStack_5bb8
                ;
                auVar53._12_4_ =
                     fVar151 * fStack_5bf4 + fVar122 * fStack_5bd4 + fVar77 * fStack_5bb4;
                auVar53._16_4_ =
                     fVar151 * fStack_5bf0 + fVar122 * fStack_5bd0 + fVar77 * fStack_5bb0;
                auVar53._20_4_ =
                     fVar151 * fStack_5bec + fVar122 * fStack_5bcc + fVar77 * fStack_5bac;
                auVar53._24_4_ =
                     fVar151 * fStack_5be8 + fVar122 * fStack_5bc8 + fVar77 * fStack_5ba8;
                auVar53._28_4_ = fStack_5be4 + fStack_5bc4 + fStack_5ba4;
                auVar131._8_4_ = 0x7fffffff;
                auVar131._0_8_ = 0x7fffffff7fffffff;
                auVar131._12_4_ = 0x7fffffff;
                auVar131._16_4_ = 0x7fffffff;
                auVar131._20_4_ = 0x7fffffff;
                auVar131._24_4_ = 0x7fffffff;
                auVar131._28_4_ = 0x7fffffff;
                auVar101 = vandps_avx(auVar113,auVar131);
                auVar139._8_4_ = 0x219392ef;
                auVar139._0_8_ = 0x219392ef219392ef;
                auVar139._12_4_ = 0x219392ef;
                auVar139._16_4_ = 0x219392ef;
                auVar139._20_4_ = 0x219392ef;
                auVar139._24_4_ = 0x219392ef;
                auVar139._28_4_ = 0x219392ef;
                auVar101 = vcmpps_avx(auVar101,auVar139,1);
                auVar67 = vblendvps_avx(auVar113,auVar139,auVar101);
                auVar101 = vandps_avx(auVar90,auVar131);
                auVar101 = vcmpps_avx(auVar101,auVar139,1);
                auVar109 = vblendvps_avx(auVar90,auVar139,auVar101);
                auVar101 = vandps_avx(auVar53,auVar131);
                auVar101 = vcmpps_avx(auVar101,auVar139,1);
                auVar97 = vrcpps_avx(auVar67);
                auVar101 = vblendvps_avx(auVar53,auVar139,auVar101);
                fVar129 = auVar97._0_4_;
                fVar132 = auVar97._4_4_;
                auVar11._4_4_ = fVar132 * auVar67._4_4_;
                auVar11._0_4_ = fVar129 * auVar67._0_4_;
                fVar133 = auVar97._8_4_;
                auVar11._8_4_ = fVar133 * auVar67._8_4_;
                fVar134 = auVar97._12_4_;
                auVar11._12_4_ = fVar134 * auVar67._12_4_;
                fVar135 = auVar97._16_4_;
                auVar11._16_4_ = fVar135 * auVar67._16_4_;
                fVar136 = auVar97._20_4_;
                auVar11._20_4_ = fVar136 * auVar67._20_4_;
                fVar137 = auVar97._24_4_;
                auVar11._24_4_ = fVar137 * auVar67._24_4_;
                auVar11._28_4_ = auVar67._28_4_;
                auVar97 = vsubps_avx(auVar105,auVar11);
                auVar67 = vrcpps_avx(auVar109);
                fVar129 = fVar129 + fVar129 * auVar97._0_4_;
                fVar132 = fVar132 + fVar132 * auVar97._4_4_;
                fVar133 = fVar133 + fVar133 * auVar97._8_4_;
                fVar134 = fVar134 + fVar134 * auVar97._12_4_;
                fVar135 = fVar135 + fVar135 * auVar97._16_4_;
                fVar136 = fVar136 + fVar136 * auVar97._20_4_;
                fVar137 = fVar137 + fVar137 * auVar97._24_4_;
                fVar64 = auVar67._0_4_;
                fVar74 = auVar67._4_4_;
                auVar12._4_4_ = fVar74 * auVar109._4_4_;
                auVar12._0_4_ = fVar64 * auVar109._0_4_;
                fVar76 = auVar67._8_4_;
                auVar12._8_4_ = fVar76 * auVar109._8_4_;
                fVar78 = auVar67._12_4_;
                auVar12._12_4_ = fVar78 * auVar109._12_4_;
                fVar80 = auVar67._16_4_;
                auVar12._16_4_ = fVar80 * auVar109._16_4_;
                fVar82 = auVar67._20_4_;
                auVar12._20_4_ = fVar82 * auVar109._20_4_;
                fVar84 = auVar67._24_4_;
                auVar12._24_4_ = fVar84 * auVar109._24_4_;
                auVar12._28_4_ = auVar97._28_4_;
                auVar97 = vsubps_avx(auVar105,auVar12);
                fVar64 = fVar64 + fVar64 * auVar97._0_4_;
                fVar74 = fVar74 + fVar74 * auVar97._4_4_;
                fVar76 = fVar76 + fVar76 * auVar97._8_4_;
                fVar78 = fVar78 + fVar78 * auVar97._12_4_;
                fVar80 = fVar80 + fVar80 * auVar97._16_4_;
                fVar82 = fVar82 + fVar82 * auVar97._20_4_;
                fVar84 = fVar84 + fVar84 * auVar97._24_4_;
                auVar109 = vrcpps_avx(auVar101);
                fVar45 = auVar109._0_4_;
                fVar57 = auVar109._4_4_;
                auVar13._4_4_ = fVar57 * auVar101._4_4_;
                auVar13._0_4_ = fVar45 * auVar101._0_4_;
                fVar58 = auVar109._8_4_;
                auVar13._8_4_ = fVar58 * auVar101._8_4_;
                fVar59 = auVar109._12_4_;
                auVar13._12_4_ = fVar59 * auVar101._12_4_;
                fVar60 = auVar109._16_4_;
                auVar13._16_4_ = fVar60 * auVar101._16_4_;
                fVar61 = auVar109._20_4_;
                auVar13._20_4_ = fVar61 * auVar101._20_4_;
                fVar62 = auVar109._24_4_;
                auVar13._24_4_ = fVar62 * auVar101._24_4_;
                auVar13._28_4_ = auVar101._28_4_;
                auVar101 = vsubps_avx(auVar105,auVar13);
                fVar45 = fVar45 + fVar45 * auVar101._0_4_;
                fVar57 = fVar57 + fVar57 * auVar101._4_4_;
                fVar58 = fVar58 + fVar58 * auVar101._8_4_;
                fVar59 = fVar59 + fVar59 * auVar101._12_4_;
                fVar60 = fVar60 + fVar60 * auVar101._16_4_;
                fVar61 = fVar61 + fVar61 * auVar101._20_4_;
                fVar62 = fVar62 + fVar62 * auVar101._24_4_;
                fVar75 = *(float *)(uVar39 + 0x180 + uVar40);
                fVar115 = fVar75 + auVar67._28_4_;
                fVar152 = *(float *)(uVar39 + 0x1a0 + uVar40);
                fVar153 = *(float *)(uVar39 + 0x1c0 + uVar40);
                fVar107 = fVar115 + 1.0;
                auVar128._0_4_ =
                     fVar81 * (float)local_5c60._0_4_ +
                     fVar116 * (float)local_5c60._32_4_ +
                     fVar75 + fVar123 * (float)local_5c60._64_4_;
                auVar128._4_4_ =
                     fVar81 * (float)local_5c60._4_4_ +
                     fVar116 * (float)local_5c60._36_4_ +
                     fVar75 + fVar123 * (float)local_5c60._68_4_;
                auVar128._8_4_ =
                     fVar81 * (float)local_5c60._8_4_ +
                     fVar116 * (float)local_5c60._40_4_ +
                     fVar75 + fVar123 * (float)local_5c60._72_4_;
                auVar128._12_4_ =
                     fVar81 * (float)local_5c60._12_4_ +
                     fVar116 * (float)local_5c60._44_4_ +
                     fVar75 + fVar123 * (float)local_5c60._76_4_;
                auVar128._16_4_ =
                     fVar81 * (float)local_5c60._16_4_ +
                     fVar116 * (float)local_5c60._48_4_ +
                     fVar75 + fVar123 * (float)local_5c60._80_4_;
                auVar128._20_4_ =
                     fVar81 * (float)local_5c60._20_4_ +
                     fVar116 * (float)local_5c60._52_4_ +
                     fVar75 + fVar123 * (float)local_5c60._84_4_;
                auVar128._24_4_ =
                     fVar81 * (float)local_5c60._24_4_ +
                     fVar116 * (float)local_5c60._56_4_ +
                     fVar75 + fVar123 * (float)local_5c60._88_4_;
                auVar128._28_4_ = fVar121 + fVar107;
                auVar114._0_4_ =
                     fVar83 * (float)local_5c60._0_4_ +
                     fVar152 + fVar63 * (float)local_5c60._64_4_ +
                     (float)local_5c60._32_4_ * fVar121;
                auVar114._4_4_ =
                     fVar83 * (float)local_5c60._4_4_ +
                     fVar152 + fVar63 * (float)local_5c60._68_4_ +
                     (float)local_5c60._36_4_ * fVar121;
                auVar114._8_4_ =
                     fVar83 * (float)local_5c60._8_4_ +
                     fVar152 + fVar63 * (float)local_5c60._72_4_ +
                     (float)local_5c60._40_4_ * fVar121;
                auVar114._12_4_ =
                     fVar83 * (float)local_5c60._12_4_ +
                     fVar152 + fVar63 * (float)local_5c60._76_4_ +
                     (float)local_5c60._44_4_ * fVar121;
                auVar114._16_4_ =
                     fVar83 * (float)local_5c60._16_4_ +
                     fVar152 + fVar63 * (float)local_5c60._80_4_ +
                     (float)local_5c60._48_4_ * fVar121;
                auVar114._20_4_ =
                     fVar83 * (float)local_5c60._20_4_ +
                     fVar152 + fVar63 * (float)local_5c60._84_4_ +
                     (float)local_5c60._52_4_ * fVar121;
                auVar114._24_4_ =
                     fVar83 * (float)local_5c60._24_4_ +
                     fVar152 + fVar63 * (float)local_5c60._88_4_ +
                     (float)local_5c60._56_4_ * fVar121;
                auVar114._28_4_ = fVar107 + fVar152 + fVar63 + fVar115;
                auVar144._0_4_ =
                     fVar151 * (float)local_5c60._0_4_ +
                     (float)local_5c60._32_4_ * fVar122 +
                     fVar153 + fVar77 * (float)local_5c60._64_4_;
                auVar144._4_4_ =
                     fVar151 * (float)local_5c60._4_4_ +
                     (float)local_5c60._36_4_ * fVar122 +
                     fVar153 + fVar77 * (float)local_5c60._68_4_;
                auVar144._8_4_ =
                     fVar151 * (float)local_5c60._8_4_ +
                     (float)local_5c60._40_4_ * fVar122 +
                     fVar153 + fVar77 * (float)local_5c60._72_4_;
                auVar144._12_4_ =
                     fVar151 * (float)local_5c60._12_4_ +
                     (float)local_5c60._44_4_ * fVar122 +
                     fVar153 + fVar77 * (float)local_5c60._76_4_;
                auVar144._16_4_ =
                     fVar151 * (float)local_5c60._16_4_ +
                     (float)local_5c60._48_4_ * fVar122 +
                     fVar153 + fVar77 * (float)local_5c60._80_4_;
                auVar144._20_4_ =
                     fVar151 * (float)local_5c60._20_4_ +
                     (float)local_5c60._52_4_ * fVar122 +
                     fVar153 + fVar77 * (float)local_5c60._84_4_;
                auVar144._24_4_ =
                     fVar151 * (float)local_5c60._24_4_ +
                     (float)local_5c60._56_4_ * fVar122 +
                     fVar153 + fVar77 * (float)local_5c60._88_4_;
                auVar144._28_4_ = fVar107 + fVar122 + fVar153 + (float)local_5c60._92_4_;
                auVar30._4_4_ = fStack_5a1c;
                auVar30._0_4_ = local_5a20;
                auVar30._8_4_ = fStack_5a18;
                auVar30._12_4_ = fStack_5a14;
                auVar30._16_4_ = fStack_5a10;
                auVar30._20_4_ = fStack_5a0c;
                auVar30._24_4_ = fStack_5a08;
                auVar30._28_4_ = fStack_5a04;
                auVar98 = vsubps_avx(auVar30,auVar128);
                auVar118._0_4_ = fVar129 * auVar98._0_4_;
                auVar118._4_4_ = fVar132 * auVar98._4_4_;
                auVar118._8_4_ = fVar133 * auVar98._8_4_;
                auVar118._12_4_ = fVar134 * auVar98._12_4_;
                auVar14._16_4_ = fVar135 * auVar98._16_4_;
                auVar14._0_16_ = auVar118;
                auVar14._20_4_ = fVar136 * auVar98._20_4_;
                auVar14._24_4_ = fVar137 * auVar98._24_4_;
                auVar14._28_4_ = local_5c60._28_4_;
                auVar32._4_4_ = fStack_59dc;
                auVar32._0_4_ = local_59e0;
                auVar32._8_4_ = fStack_59d8;
                auVar32._12_4_ = fStack_59d4;
                auVar32._16_4_ = fStack_59d0;
                auVar32._20_4_ = fStack_59cc;
                auVar32._24_4_ = fStack_59c8;
                auVar32._28_4_ = fStack_59c4;
                auVar98 = vsubps_avx(auVar32,auVar114);
                auVar87._0_4_ = fVar64 * auVar98._0_4_;
                auVar87._4_4_ = fVar74 * auVar98._4_4_;
                auVar87._8_4_ = fVar76 * auVar98._8_4_;
                auVar87._12_4_ = fVar78 * auVar98._12_4_;
                auVar15._16_4_ = fVar80 * auVar98._16_4_;
                auVar15._0_16_ = auVar87;
                auVar15._20_4_ = fVar82 * auVar98._20_4_;
                auVar15._24_4_ = fVar84 * auVar98._24_4_;
                auVar15._28_4_ = auVar98._28_4_;
                auVar24._4_4_ = fVar157 + fVar150 * fVar73;
                auVar24._0_4_ = fVar156 + fVar149 * fVar73;
                auVar24._8_4_ = fStack_5c98;
                auVar24._12_4_ = fStack_5c94;
                auVar24._16_4_ = fStack_5c90;
                auVar24._20_4_ = fStack_5c8c;
                auVar24._24_4_ = fStack_5c88;
                auVar24._28_4_ = fStack_5c84;
                auVar99 = vsubps_avx(auVar24,auVar144);
                auVar95._0_4_ = fVar45 * auVar99._0_4_;
                auVar95._4_4_ = fVar57 * auVar99._4_4_;
                auVar95._8_4_ = fVar58 * auVar99._8_4_;
                auVar95._12_4_ = fVar59 * auVar99._12_4_;
                auVar16._16_4_ = fVar60 * auVar99._16_4_;
                auVar16._0_16_ = auVar95;
                auVar16._20_4_ = fVar61 * auVar99._20_4_;
                auVar16._24_4_ = fVar62 * auVar99._24_4_;
                auVar16._28_4_ = auVar99._28_4_;
                auVar29._4_4_ = fStack_5a3c;
                auVar29._0_4_ = local_5a40;
                auVar29._8_4_ = fStack_5a38;
                auVar29._12_4_ = fStack_5a34;
                auVar29._16_4_ = fStack_5a30;
                auVar29._20_4_ = fStack_5a2c;
                auVar29._24_4_ = fStack_5a28;
                auVar29._28_4_ = fStack_5a24;
                auVar99 = vsubps_avx(auVar29,auVar128);
                auVar125._0_4_ = fVar129 * auVar99._0_4_;
                auVar125._4_4_ = fVar132 * auVar99._4_4_;
                auVar125._8_4_ = fVar133 * auVar99._8_4_;
                auVar125._12_4_ = fVar134 * auVar99._12_4_;
                auVar17._16_4_ = fVar135 * auVar99._16_4_;
                auVar17._0_16_ = auVar125;
                auVar17._20_4_ = fVar136 * auVar99._20_4_;
                auVar17._24_4_ = fVar137 * auVar99._24_4_;
                auVar17._28_4_ = auVar99._28_4_;
                auVar31._4_4_ = fStack_59fc;
                auVar31._0_4_ = local_5a00;
                auVar31._8_4_ = fStack_59f8;
                auVar31._12_4_ = fStack_59f4;
                auVar31._16_4_ = fStack_59f0;
                auVar31._20_4_ = fStack_59ec;
                auVar31._24_4_ = fStack_59e8;
                auVar31._28_4_ = fStack_59e4;
                auVar99 = vsubps_avx(auVar31,auVar114);
                auVar65._0_4_ = fVar64 * auVar99._0_4_;
                auVar65._4_4_ = fVar74 * auVar99._4_4_;
                auVar65._8_4_ = fVar76 * auVar99._8_4_;
                auVar65._12_4_ = fVar78 * auVar99._12_4_;
                auVar18._16_4_ = fVar80 * auVar99._16_4_;
                auVar18._0_16_ = auVar65;
                auVar18._20_4_ = fVar82 * auVar99._20_4_;
                auVar18._24_4_ = fVar84 * auVar99._24_4_;
                auVar18._28_4_ = auVar67._28_4_ + auVar97._28_4_;
                auVar22._4_4_ = fVar155 + fVar150 * fVar79;
                auVar22._0_4_ = fVar154 + fVar149 * fVar79;
                auVar22._8_4_ = fStack_5cb8;
                auVar22._12_4_ = fStack_5cb4;
                auVar22._16_4_ = fStack_5cb0;
                auVar22._20_4_ = fStack_5cac;
                auVar22._24_4_ = fStack_5ca8;
                auVar22._28_4_ = fStack_5ca4;
                auVar67 = vsubps_avx(auVar22,auVar144);
                auVar48._0_4_ = fVar45 * auVar67._0_4_;
                auVar48._4_4_ = fVar57 * auVar67._4_4_;
                auVar48._8_4_ = fVar58 * auVar67._8_4_;
                auVar48._12_4_ = fVar59 * auVar67._12_4_;
                auVar19._16_4_ = fVar60 * auVar67._16_4_;
                auVar19._0_16_ = auVar48;
                auVar19._20_4_ = fVar61 * auVar67._20_4_;
                auVar19._24_4_ = fVar62 * auVar67._24_4_;
                auVar19._28_4_ = auVar109._28_4_ + auVar101._28_4_;
                auVar50 = vpminsd_avx(auVar14._16_16_,auVar17._16_16_);
                auVar96 = vpminsd_avx(auVar118,auVar125);
                auVar66 = vpminsd_avx(auVar15._16_16_,auVar18._16_16_);
                auVar50 = vpmaxsd_avx(auVar50,auVar66);
                auVar66 = vpminsd_avx(auVar87,auVar65);
                auVar96 = vpmaxsd_avx(auVar96,auVar66);
                auVar66 = vpminsd_avx(auVar95,auVar48);
                auVar96 = vpmaxsd_avx(auVar96,auVar66);
                auVar66 = vpminsd_avx(auVar16._16_16_,auVar19._16_16_);
                auVar50 = vpmaxsd_avx(auVar50,auVar66);
                auVar66 = vpmaxsd_avx(auVar14._16_16_,auVar17._16_16_);
                auVar146 = vpmaxsd_avx(auVar118,auVar125);
                auVar142 = vpmaxsd_avx(auVar15._16_16_,auVar18._16_16_);
                auVar142 = vpminsd_avx(auVar66,auVar142);
                auVar66 = vpmaxsd_avx(auVar87,auVar65);
                auVar146 = vpminsd_avx(auVar146,auVar66);
                auVar66 = vpmaxsd_avx(auVar95,auVar48);
                auVar146 = vpminsd_avx(auVar146,auVar66);
                auVar66 = vpmaxsd_avx(auVar16._16_16_,auVar19._16_16_);
                auVar66 = vpminsd_avx(auVar142,auVar66);
                auVar88._0_4_ = auVar96._0_4_ * 0.99999964;
                auVar88._4_4_ = auVar96._4_4_ * 0.99999964;
                auVar88._8_4_ = auVar96._8_4_ * 0.99999964;
                auVar88._12_4_ = auVar96._12_4_ * 0.99999964;
                auVar20._16_4_ = auVar50._0_4_ * 0.99999964;
                auVar20._0_16_ = auVar88;
                auVar20._20_4_ = auVar50._4_4_ * 0.99999964;
                auVar20._24_4_ = auVar50._8_4_ * 0.99999964;
                auVar20._28_4_ = auVar98._28_4_;
                auVar93 = ZEXT3264(auVar20);
                auVar49._0_4_ = auVar146._0_4_ * 1.0000004;
                auVar49._4_4_ = auVar146._4_4_ * 1.0000004;
                auVar49._8_4_ = auVar146._8_4_ * 1.0000004;
                auVar49._12_4_ = auVar146._12_4_ * 1.0000004;
                auVar21._16_4_ = auVar66._0_4_ * 1.0000004;
                auVar21._0_16_ = auVar49;
                auVar21._20_4_ = auVar66._4_4_ * 1.0000004;
                auVar21._24_4_ = auVar66._8_4_ * 1.0000004;
                auVar21._28_4_ = auVar66._12_4_;
                auVar50 = vpmaxsd_avx(auVar88,local_5ae0._0_16_);
                auVar96 = vpmaxsd_avx(auVar20._16_16_,local_5ae0._16_16_);
                auVar66 = vpminsd_avx(auVar49,local_5ac0._0_16_);
                auVar69._16_16_ = auVar96;
                auVar69._0_16_ = auVar50;
                auVar50 = vpminsd_avx(auVar21._16_16_,local_5ac0._16_16_);
                auVar54._16_16_ = auVar50;
                auVar54._0_16_ = auVar66;
                auVar67 = vcmpps_avx(auVar69,auVar54,2);
              }
              auVar50 = vpackssdw_avx(auVar67._0_16_,auVar67._16_16_);
              auVar96 = vpackssdw_avx(local_5c80._0_16_,local_5c80._16_16_);
              auVar50 = vpand_avx(auVar50,auVar96);
              auVar96 = vpmovzxwd_avx(auVar50);
              auVar66 = vpslld_avx(auVar96,0x1f);
              auVar96 = vpunpckhwd_avx(auVar50,auVar50);
              auVar96 = vpslld_avx(auVar96,0x1f);
              auVar106._16_16_ = auVar96;
              auVar106._0_16_ = auVar66;
              pBVar42 = (BVH *)root.ptr;
              auVar68 = auVar92;
              if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar106 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar106 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar106 >> 0x7f,0) != '\0') ||
                    (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB161(auVar96 >> 0x3f,0) != '\0') ||
                  (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar96[0xf] < '\0') {
                auVar50 = vpunpckhwd_avx(auVar50,auVar50);
                auVar50 = vpslld_avx(auVar50,0x1f);
                auVar55._16_16_ = auVar50;
                auVar55._0_16_ = auVar66;
                auVar70._8_4_ = 0x7f800000;
                auVar70._0_8_ = 0x7f8000007f800000;
                auVar70._12_4_ = 0x7f800000;
                auVar70._16_4_ = 0x7f800000;
                auVar70._20_4_ = 0x7f800000;
                auVar70._24_4_ = 0x7f800000;
                auVar70._28_4_ = 0x7f800000;
                auVar68 = vblendvps_avx(auVar70,auVar93._0_32_,auVar55);
                pBVar42 = pBVar43;
                if ((BVH *)root.ptr != (BVH *)0x8) {
                  *psVar41 = root.ptr;
                  psVar41 = psVar41 + 1;
                  local_5ce0._0_8_ = auVar92._0_8_;
                  local_5ce0._8_8_ = auVar92._8_8_;
                  local_5ce0._16_8_ = auVar92._16_8_;
                  local_5ce0._24_8_ = auVar92._24_8_;
                  *(undefined8 *)*pauVar44 = local_5ce0._0_8_;
                  *(undefined8 *)(*pauVar44 + 8) = local_5ce0._8_8_;
                  *(undefined8 *)(*pauVar44 + 0x10) = local_5ce0._16_8_;
                  *(undefined8 *)(*pauVar44 + 0x18) = local_5ce0._24_8_;
                  pauVar44 = pauVar44 + 1;
                }
              }
              root.ptr = (size_t)pBVar42;
              local_5ce0 = auVar92;
            }
            uVar39 = uVar40;
            pBVar42 = pBVar43;
            if ((BVH *)root.ptr == (BVH *)0x8) goto LAB_0103631f;
            auVar101 = vcmpps_avx(local_5ac0,auVar92,6);
            uVar38 = vmovmskps_avx(auVar101);
          } while ((byte)uVar37 < (byte)POPCOUNT(uVar38));
          *psVar41 = root.ptr;
          psVar41 = psVar41 + 1;
          *pauVar44 = auVar92;
          pauVar44 = pauVar44 + 1;
LAB_0103631f:
          iVar35 = 4;
        }
        else {
          uStack_5cbc = 0;
          local_5ce0 = auVar92;
          while (auVar50 = auVar93._0_16_, uVar39 != 0) {
            sVar1 = 0;
            if (uVar39 != 0) {
              for (; (uVar39 >> sVar1 & 1) == 0; sVar1 = sVar1 + 1) {
              }
            }
            local_5c80._0_8_ = uVar39 & uVar39 - 1;
            local_5ca0._0_4_ = (undefined4)sVar1;
            local_5ca0._4_4_ = (undefined4)(sVar1 >> 0x20);
            auVar93 = ZEXT1664(auVar50);
            in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
            pBVar42 = local_5cf0;
            bVar34 = occluded1(This,local_5cf0,root,sVar1,(Precalculations *)&local_59c0,ray,
                               (TravRayK<8,_true> *)&local_5c60.field_0,context);
            uVar39 = local_5c80._0_8_;
            if (bVar34) {
              *(undefined4 *)(local_5d20 + CONCAT44(local_5ca0._4_4_,(undefined4)local_5ca0) * 4) =
                   0xffffffff;
            }
          }
          auVar50 = vpcmpeqd_avx(auVar50,auVar50);
          auVar96 = vpcmpgtd_avx(stack0xffffffffffffa2f0,auVar50);
          auVar50 = vpcmpgtd_avx(local_5d20._0_16_,auVar50);
          auVar93 = ZEXT1664(auVar50);
          auVar50 = vpor_avx(auVar50,auVar96);
          iVar35 = 3;
          if ((((auVar50 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar50 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar50 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar50[0xf] < '\0') {
            auVar92._8_4_ = 0xff800000;
            auVar92._0_8_ = 0xff800000ff800000;
            auVar92._12_4_ = 0xff800000;
            auVar92._16_4_ = 0xff800000;
            auVar92._20_4_ = 0xff800000;
            auVar92._24_4_ = 0xff800000;
            auVar92._28_4_ = 0xff800000;
            auVar93 = ZEXT3264(auVar92);
            local_5ac0 = vblendvps_avx(local_5ac0,auVar92,_local_5d20);
            iVar35 = 2;
          }
          auVar72 = ZEXT3264(local_5ce0);
          uVar39 = 0;
          if (uVar37 < local_5cc0) goto LAB_01035bda;
          uVar39 = 0;
        }
      } while (iVar35 != 3);
LAB_01036562:
      auVar92 = vandps_avx(local_5aa0,_local_5d20);
      auVar71._8_4_ = 0xff800000;
      auVar71._0_8_ = 0xff800000ff800000;
      auVar71._12_4_ = 0xff800000;
      auVar71._16_4_ = 0xff800000;
      auVar71._20_4_ = 0xff800000;
      auVar71._24_4_ = 0xff800000;
      auVar71._28_4_ = 0xff800000;
      auVar92 = vmaskmovps_avx(auVar92,auVar71);
      *(undefined1 (*) [32])local_5ce8 = auVar92;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }